

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_xml_lite.cpp
# Opt level: O3

Tag * Omega_h::xml_lite::read_tag(Tag *__return_storage_ptr__,istream *stream)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  bool bVar3;
  string line;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,(string *)&local_38,cVar2);
  (__return_storage_ptr__->elem_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->elem_name).field_2;
  (__return_storage_ptr__->elem_name)._M_string_length = 0;
  (__return_storage_ptr__->elem_name).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->attribs)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->attribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->attribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->attribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->attribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->attribs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar3 = parse_tag(&local_38,__return_storage_ptr__);
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","check",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_xml_lite.cpp"
       ,0x6b);
}

Assistant:

xml_lite::Tag read_tag(std::istream& stream) {
  std::string line;
  std::getline(stream, line);
  xml_lite::Tag st;
  auto check = parse_tag(line, &st);
  OMEGA_H_CHECK(check);
  return st;
}